

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPlot.cpp
# Opt level: O1

float SVGChart::GetMaxFromRange(PlotDataBase *inData,long inStartIndex,long inEndIndex)

{
  long lVar1;
  float data;
  float fVar2;
  undefined8 local_28;
  
  local_28 = 0;
  if (inStartIndex <= inEndIndex) {
    lVar1 = 0;
    local_28 = 0;
    do {
      fVar2 = PlotDataBase::GetValue(inData,inStartIndex + lVar1);
      if ((lVar1 == 0) || (local_28._4_4_ < ABS(fVar2))) {
        local_28 = CONCAT44(ABS(fVar2),fVar2);
      }
      lVar1 = lVar1 + 1;
    } while ((inEndIndex - inStartIndex) + 1 != lVar1);
  }
  return (float)local_28;
}

Assistant:

float GetMaxFromRange (const PlotDataBase &inData, long inStartIndex, long inEndIndex) {
        float max = 0;
        float fabsMax = 0;
        for (long theI = inStartIndex; theI <= inEndIndex; theI++) {
            if (theI == inStartIndex) {
                max = inData.GetValue (theI);
                fabsMax = fabs (max);
            }
            else {
                float data = inData.GetValue (theI);
                if (fabs (data) > fabsMax) {
                    max = data;
                    fabsMax = fabs (data);
                }
            }
        }

        return max;
    }